

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrFrameEndInfo *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  XrEnvironmentBlendMode XVar4;
  pointer pcVar5;
  PFN_xrStructureTypeToString p_Var6;
  void *value_00;
  XrCompositionLayerBaseHeader *value_01;
  XrStructureType __val;
  XrEnvironmentBlendMode __val_00;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char cVar10;
  char *pcVar11;
  XrInstance pXVar12;
  invalid_argument *piVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  string type_prefix;
  string next_prefix;
  string displaytime_prefix;
  string environmentblendmode_prefix;
  string layercount_prefix;
  string layers_prefix;
  string layers_array_prefix;
  ostringstream oss_layerCount;
  string __str_3;
  ostringstream oss_layers_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  long *local_5e0;
  long local_5d8;
  long local_5d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  string local_520;
  string local_500;
  XrGeneratedDispatchTable *local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  paVar1 = &local_498.field_2;
  local_498._M_dataplus._M_p = (pointer)paVar1;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_498,'\x12');
  *local_498._M_dataplus._M_p = '0';
  local_498._M_dataplus._M_p[1] = 'x';
  pcVar11 = local_498._M_dataplus._M_p + (local_498._M_string_length - 1);
  lVar15 = 0;
  do {
    bVar2 = local_1a8[lVar15];
    *pcVar11 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar11[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar15 = lVar15 + 1;
    pcVar11 = pcVar11 + -2;
  } while (lVar15 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != paVar1) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_600,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_600);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar19 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar17 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar19 = uVar7;
        uVar14 = (uint)uVar17;
        if (uVar14 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_00139736;
        }
        if (uVar14 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_00139736;
        }
        if (uVar14 < 10000) goto LAB_00139736;
        uVar17 = uVar17 / 10000;
        uVar7 = uVar19 + 4;
      } while (99999 < uVar14);
      uVar19 = uVar19 + 1;
    }
LAB_00139736:
    local_498._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_498,(char)uVar19 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_498._M_dataplus._M_p + (XVar3 >> 0x1f),uVar19,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_600,&local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_498.field_2._M_allocated_capacity = 0;
    local_498.field_2._8_8_ = 0;
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    p_Var6 = gen_dispatch_table->StructureTypeToString;
    pXVar12 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var6)(pXVar12,value->type,(char *)&local_498);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_600,(char (*) [64])&local_498);
  }
  local_5e0 = local_5d0;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e0,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_5e0);
  value_00 = value->next;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b8,local_5e0,local_5d8 + (long)local_5e0);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4b8,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5c0,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_5c0);
  uVar17 = value->displayTime;
  uVar18 = -uVar17;
  if (0 < (long)uVar17) {
    uVar18 = uVar17;
  }
  uVar19 = 1;
  if (9 < uVar18) {
    uVar16 = uVar18;
    uVar7 = 4;
    do {
      uVar19 = uVar7;
      if (uVar16 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_001398ed;
      }
      if (uVar16 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_001398ed;
      }
      if (uVar16 < 10000) goto LAB_001398ed;
      bVar9 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      uVar7 = uVar19 + 4;
    } while (bVar9);
    uVar19 = uVar19 + 1;
  }
LAB_001398ed:
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  local_4e0 = gen_dispatch_table;
  std::__cxx11::string::_M_construct((ulong)&local_498,(char)uVar19 - (char)((long)uVar17 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_498._M_dataplus._M_p + -((long)uVar17 >> 0x3f),uVar19,uVar18);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])"XrTime",&local_5c0,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a0,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_5a0);
  XVar4 = value->environmentBlendMode;
  __val_00 = -XVar4;
  if (0 < (int)XVar4) {
    __val_00 = XVar4;
  }
  uVar19 = 1;
  if (9 < __val_00) {
    uVar17 = (ulong)__val_00;
    uVar7 = 4;
    do {
      uVar19 = uVar7;
      uVar14 = (uint)uVar17;
      if (uVar14 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_00139a08;
      }
      if (uVar14 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_00139a08;
      }
      if (uVar14 < 10000) goto LAB_00139a08;
      uVar17 = uVar17 / 10000;
      uVar7 = uVar19 + 4;
    } while (99999 < uVar14);
    uVar19 = uVar19 + 1;
  }
LAB_00139a08:
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_498,(char)uVar19 - (char)((int)XVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_498._M_dataplus._M_p + (XVar4 >> 0x1f),uVar19,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[23],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [23])"XrEnvironmentBlendMode",&local_5a0,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_580,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_580);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,"0x",2);
  *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_498);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_580,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  if ((XrFrameEndInfo *)local_1a8._0_8_ != (XrFrameEndInfo *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_560,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_560);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + *(XrTime *)(local_1a8._0_8_ + -0x18)) =
       *(uint *)((long)auStack_190 + *(XrTime *)(local_1a8._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[43],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [43])"const XrCompositionLayerBaseHeader* const*",&local_560,
             local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if (value->layerCount != 0) {
    uVar17 = 0;
    do {
      local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_540,local_560._M_dataplus._M_p,
                 local_560._M_dataplus._M_p + local_560._M_string_length);
      std::__cxx11::string::append((char *)&local_540);
      cVar10 = '\x01';
      if (9 < uVar17) {
        uVar18 = uVar17;
        cVar8 = '\x04';
        do {
          cVar10 = cVar8;
          uVar19 = (uint)uVar18;
          if (uVar19 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_00139ce9;
          }
          if (uVar19 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_00139ce9;
          }
          if (uVar19 < 10000) goto LAB_00139ce9;
          uVar18 = (uVar18 & 0xffffffff) / 10000;
          cVar8 = cVar10 + '\x04';
        } while (99999 < uVar19);
        cVar10 = cVar10 + '\x01';
      }
LAB_00139ce9:
      local_320[0]._M_dataplus._M_p = (pointer)&local_320[0].field_2;
      std::__cxx11::string::_M_construct((ulong)local_320,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_320[0]._M_dataplus._M_p,(uint)local_320[0]._M_string_length,(uint)uVar17);
      std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_320[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
        operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::__cxx11::string::append((char *)&local_540);
      value_01 = value->layers[uVar17];
      if (value_01 == (XrCompositionLayerBaseHeader *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8
                 ) = *(uint *)((long)&local_320[0].field_2 +
                              *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8
        ;
        std::ostream::_M_insert<void_const*>(local_320);
        std::__cxx11::stringbuf::str();
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[43],std::__cxx11::string&,std::__cxx11::string>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [43])"const XrCompositionLayerBaseHeader* const*",
                   &local_540,&local_4d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
      }
      else {
        local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_520,local_540._M_dataplus._M_p,
                   local_540._M_dataplus._M_p + local_540._M_string_length);
        local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_500,"const XrCompositionLayerBaseHeader* const*","");
        bVar9 = ApiDumpOutputXrStruct(local_4e0,value_01,&local_520,&local_500,true,contents);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500._M_dataplus._M_p != &local_500.field_2) {
          operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
        }
        if (!bVar9) {
          piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
          __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540._M_dataplus._M_p != &local_540.field_2) {
        operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < value->layerCount);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
  std::ios_base::~ios_base(local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if (local_5e0 != local_5d0) {
    operator_delete(local_5e0,local_5d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrFrameEndInfo* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string displaytime_prefix = prefix;
        displaytime_prefix += "displayTime";
        contents.emplace_back("XrTime", displaytime_prefix, std::to_string(value->displayTime));
        std::string environmentblendmode_prefix = prefix;
        environmentblendmode_prefix += "environmentBlendMode";
        contents.emplace_back("XrEnvironmentBlendMode", environmentblendmode_prefix, std::to_string(value->environmentBlendMode));
        std::string layercount_prefix = prefix;
        layercount_prefix += "layerCount";
        std::ostringstream oss_layerCount;
        oss_layerCount << "0x" << std::hex << (value->layerCount);
        contents.emplace_back("uint32_t", layercount_prefix, oss_layerCount.str());
        std::string layers_prefix = prefix;
        layers_prefix += "layers";
        std::ostringstream oss_layers_array;
        oss_layers_array << std::hex << reinterpret_cast<const void*>(value->layers);
        contents.emplace_back("const XrCompositionLayerBaseHeader* const*", layers_prefix, oss_layers_array.str());
        for (uint32_t value_layers_inc = 0; value_layers_inc < value->layerCount; ++value_layers_inc) {
            std::string layers_array_prefix = layers_prefix;
            layers_array_prefix += "[";
            layers_array_prefix += std::to_string(value_layers_inc);
            layers_array_prefix += "]";
            if (nullptr == value->layers[value_layers_inc]) {
                std::ostringstream oss_layers;
                oss_layers << std::hex << reinterpret_cast<const void*>(value->layers[value_layers_inc]);
                contents.emplace_back("const XrCompositionLayerBaseHeader* const*", layers_array_prefix, oss_layers.str());
            } else if (!ApiDumpOutputXrStruct(gen_dispatch_table, value->layers[value_layers_inc], layers_array_prefix, "const XrCompositionLayerBaseHeader* const*", true, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}